

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void concept_suite::run(void)

{
  iterator_move_constructible();
  iterator_copy_constructible();
  iterator_copy_assignable();
  iterator_destructible();
  iterator_swappable();
  iterator_traits();
  iterator_dereferenceable();
  iterator_incrementable();
  input_iterator_equality_comparable();
  input_iterator_dereferenceable();
  input_iterator_post_incrementable();
  forward_iterator_default_constructible();
  forward_iterator_multipass();
  bidirectional_iterator_decrementable();
  bidirectional_iterator_post_decrementable();
  random_access_iterator_addition_assignment();
  random_access_iterator_addition();
  random_access_iterator_subtraction_assignment();
  random_access_iterator_subtraction();
  random_access_iterator_difference();
  random_access_iterator_index();
  random_access_iterator_less();
  random_access_iterator_less_equal();
  random_access_iterator_greater();
  random_access_iterator_greater_equal();
  return;
}

Assistant:

void run()
{
    // [iterator.iterators]
    iterator_move_constructible();
    iterator_copy_constructible();
    iterator_copy_assignable();
    iterator_destructible();
    iterator_swappable();
    iterator_traits();
    iterator_dereferenceable();
    iterator_incrementable();

    // [input.iterators]
    input_iterator_equality_comparable();
    input_iterator_dereferenceable();
    input_iterator_post_incrementable();

    // [forward.iterators]
    forward_iterator_default_constructible();
    forward_iterator_multipass();

    // [bidirectional.iterators]
    bidirectional_iterator_decrementable();
    bidirectional_iterator_post_decrementable();

    // [random.access.iterators]
    random_access_iterator_addition_assignment();
    random_access_iterator_addition();
    random_access_iterator_subtraction_assignment();
    random_access_iterator_subtraction();
    random_access_iterator_difference();
    random_access_iterator_index();
    random_access_iterator_less();
    random_access_iterator_less_equal();
    random_access_iterator_greater();
    random_access_iterator_greater_equal();
}